

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

string * duckdb::Base64Decode(string *key)

{
  pointer puVar1;
  string *in_RDI;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> output;
  idx_t result_size;
  string *decoded_key;
  uchar *in_stack_ffffffffffffff88;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff90;
  ulong uVar2;
  string *in_stack_ffffffffffffff98;
  allocator *paVar3;
  string *this;
  allocator local_4e;
  undefined1 local_4d;
  anon_union_16_2_67f50693_for_value local_40;
  anon_union_16_2_67f50693_for_value local_28;
  ulong local_18;
  
  this = in_RDI;
  string_t::string_t((string_t *)in_RDI,in_stack_ffffffffffffff98);
  local_18 = duckdb::Blob::FromBase64Size((string_t)local_28);
  operator_new__(local_18);
  unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>,true>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  string_t::string_t((string_t *)this,in_stack_ffffffffffffff98);
  puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (in_stack_ffffffffffffff90);
  duckdb::Blob::FromBase64((string_t)local_40,puVar1,local_18);
  local_4d = 0;
  puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (in_stack_ffffffffffffff90);
  paVar3 = &local_4e;
  uVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this,(char *)puVar1,uVar2,paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e);
  local_4d = 1;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *)0x6108d5);
  return in_RDI;
}

Assistant:

string Base64Decode(const string &key) {
	auto result_size = Blob::FromBase64Size(key);
	auto output = duckdb::unique_ptr<unsigned char[]>(new unsigned char[result_size]);
	Blob::FromBase64(key, output.get(), result_size);
	string decoded_key(reinterpret_cast<const char *>(output.get()), result_size);
	return decoded_key;
}